

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmGeneratorTarget::GetLinkOptions
          (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *language)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *ppbVar2;
  pointer *ppEVar3;
  cmMakefile *pcVar4;
  pointer pcVar5;
  size_t __n;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pBVar6;
  pointer pBVar7;
  pointer pbVar8;
  bool bVar9;
  PolicyStatus PVar10;
  int iVar11;
  iterator iVar12;
  string *psVar13;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var14;
  long *plVar15;
  iterator iVar16;
  iterator this_00;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__x;
  size_type *psVar17;
  pointer pbVar18;
  long lVar19;
  char *pcVar20;
  iterator __position;
  iterator this_01;
  bool bVar21;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_00;
  string wrapper;
  string wrapperSep;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  options;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  hostOptions;
  EvaluatedTargetPropertyEntries entries;
  cmList wrapperFlag;
  cmList debugProperties;
  string local_148;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniqueOptions;
  ConfigAndLanguage cacheKey;
  cmGeneratorExpressionDAGChecker dagChecker;
  
  pcVar20 = "";
  bVar21 = this->DeviceLink != false;
  if (bVar21) {
    pcVar20 = "-device";
  }
  dagChecker.Target = (cmGeneratorTarget *)(language->_M_dataplus)._M_p;
  dagChecker.Parent = (cmGeneratorExpressionDAGChecker *)language->_M_string_length;
  dagChecker.Property._M_string_length = 7;
  if (!bVar21) {
    dagChecker.Property._M_string_length = 0;
  }
  dagChecker.Property._M_dataplus._M_p = (pointer)0x0;
  dagChecker.Property.field_2._8_8_ = 0;
  views._M_len = 2;
  views._M_array = (iterator)&dagChecker;
  dagChecker.Property.field_2._M_allocated_capacity = (size_type)pcVar20;
  cmCatViews((string *)&uniqueOptions,views);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&cacheKey,config,(string *)&uniqueOptions);
  if ((__node_base *)uniqueOptions._M_h._M_buckets != &uniqueOptions._M_h._M_before_begin) {
    operator_delete(uniqueOptions._M_h._M_buckets,
                    (ulong)((long)&(uniqueOptions._M_h._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  iVar12 = std::
           _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
           ::find(&(this->LinkOptionsCache)._M_t,&cacheKey);
  if ((_Rb_tree_header *)iVar12._M_node ==
      &(this->LinkOptionsCache)._M_t._M_impl.super__Rb_tree_header) {
    (__return_storage_ptr__->
    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uniqueOptions._M_h._M_buckets = &uniqueOptions._M_h._M_single_bucket;
    uniqueOptions._M_h._M_bucket_count = 1;
    uniqueOptions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    uniqueOptions._M_h._M_element_count = 0;
    uniqueOptions._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    uniqueOptions._M_h._M_rehash_policy._M_next_resize = 0;
    uniqueOptions._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"LINK_OPTIONS","");
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              (&dagChecker,this,&local_148,(GeneratorExpressionContent *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    pcVar4 = this->Makefile;
    paVar1 = &wrapper.field_2;
    wrapper._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&wrapper,"CMAKE_DEBUG_TARGET_PROPERTIES","");
    psVar13 = (string *)cmMakefile::GetDefinition(pcVar4,&wrapper);
    if (psVar13 == (string *)0x0) {
      psVar13 = &cmValue::Empty_abi_cxx11_;
    }
    ppEVar3 = &entries.Entries.
               super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pcVar5 = (psVar13->_M_dataplus)._M_p;
    entries.Entries.
    super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)ppEVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&entries,pcVar5,pcVar5 + psVar13->_M_string_length);
    init._M_len = 1;
    init._M_array = (iterator)&entries;
    cmList::cmList(&debugProperties,init);
    if (entries.Entries.
        super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppEVar3) {
      operator_delete(entries.Entries.
                      super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&(entries.Entries.
                                      super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     LinkImplItem + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)wrapper._M_dataplus._M_p != paVar1) {
      operator_delete(wrapper._M_dataplus._M_p,wrapper.field_2._M_allocated_capacity + 1);
    }
    if (this->DebugLinkOptionsDone == false) {
      _Var14 = std::
               __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[13]>>
                         (debugProperties.Values.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          debugProperties.Values.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,"LINK_OPTIONS");
      bVar21 = _Var14._M_current !=
               debugProperties.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      bVar21 = false;
    }
    if (this->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == true) {
      this->DebugLinkOptionsDone = true;
    }
    EvaluateTargetPropertyEntries
              (&entries,this,config,language,&dagChecker,&this->LinkOptionsEntries);
    wrapper._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&wrapper,"INTERFACE_LINK_OPTIONS","");
    PVar10 = cmPolicies::PolicyMap::Get(&this->PolicyMap,CMP0099);
    AddInterfaceEntries(this,config,&wrapper,language,&dagChecker,&entries,Yes,(uint)(PVar10 == NEW)
                       );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)wrapper._M_dataplus._M_p != paVar1) {
      operator_delete(wrapper._M_dataplus._M_p,wrapper.field_2._M_allocated_capacity + 1);
    }
    anon_unknown.dwarf_24a5376::processOptions
              (this,&entries,__return_storage_ptr__,&uniqueOptions,bVar21,"link options",Shell,
               this->DeviceLink);
    if (this->DeviceLink == true) {
      pcVar4 = this->Makefile;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&options,
                     "CMAKE_",language);
      plVar15 = (long *)std::__cxx11::string::append((char *)&options);
      psVar17 = (size_type *)(plVar15 + 2);
      if ((size_type *)*plVar15 == psVar17) {
        wrapperSep.field_2._M_allocated_capacity = *psVar17;
        wrapperSep.field_2._8_8_ = plVar15[3];
        wrapperSep._M_dataplus._M_p = (pointer)&wrapperSep.field_2;
      }
      else {
        wrapperSep.field_2._M_allocated_capacity = *psVar17;
        wrapperSep._M_dataplus._M_p = (pointer)*plVar15;
      }
      wrapperSep._M_string_length = plVar15[1];
      *plVar15 = (long)psVar17;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      psVar13 = cmMakefile::GetSafeDefinition(pcVar4,&wrapperSep);
      pcVar5 = (psVar13->_M_dataplus)._M_p;
      wrapper._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&wrapper,pcVar5,pcVar5 + psVar13->_M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)wrapperSep._M_dataplus._M_p != &wrapperSep.field_2) {
        operator_delete(wrapperSep._M_dataplus._M_p,wrapperSep.field_2._M_allocated_capacity + 1);
      }
      ppbVar2 = &options.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (options.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar2) {
        operator_delete(options.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((options.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      wrapperSep._M_dataplus._M_p = (pointer)&wrapperSep.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&wrapperSep,wrapper._M_dataplus._M_p,
                 wrapper._M_dataplus._M_p + wrapper._M_string_length);
      init_00._M_len = 1;
      init_00._M_array = &wrapperSep;
      cmList::cmList(&wrapperFlag,init_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)wrapperSep._M_dataplus._M_p != &wrapperSep.field_2) {
        operator_delete(wrapperSep._M_dataplus._M_p,wrapperSep.field_2._M_allocated_capacity + 1);
      }
      pcVar4 = this->Makefile;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &hostOptions,"CMAKE_",language);
      plVar15 = (long *)std::__cxx11::string::append((char *)&hostOptions);
      pbVar18 = (pointer)(plVar15 + 2);
      if ((pointer)*plVar15 == pbVar18) {
        options.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar18->_M_dataplus)._M_p;
        options.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar2;
      }
      else {
        options.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar18->_M_dataplus)._M_p;
        options.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar15;
      }
      options.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar15[1];
      *plVar15 = (long)pbVar18;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      psVar13 = cmMakefile::GetSafeDefinition(pcVar4,(string *)&options);
      wrapperSep._M_dataplus._M_p = (pointer)&wrapperSep.field_2;
      pcVar5 = (psVar13->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&wrapperSep,pcVar5,pcVar5 + psVar13->_M_string_length);
      if (options.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar2) {
        operator_delete(options.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((options.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      if (hostOptions.
          super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&hostOptions.
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(hostOptions.
                        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((hostOptions.
                                         super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->Value)
                                       ._M_dataplus._M_p + 1));
      }
      bVar21 = true;
      if ((wrapperFlag.Values.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           wrapperFlag.Values.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         (iVar11 = std::__cxx11::string::compare
                             ((char *)(wrapperFlag.Values.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish + -1)),
         iVar11 == 0)) {
        pbVar18 = wrapperFlag.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1;
        pcVar5 = wrapperFlag.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p;
        pbVar8 = wrapperFlag.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
        wrapperFlag.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar18;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar5 != &pbVar8->field_2) {
          operator_delete(pcVar5,(pbVar8->field_2)._M_allocated_capacity + 1);
        }
        bVar21 = false;
      }
      iVar16._M_current =
           (__return_storage_ptr__->
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      while (iVar16._M_current !=
             (__return_storage_ptr__->
             super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish) {
        __n = ((iVar16._M_current)->Value)._M_string_length;
        if ((__n == (anonymous_namespace)::DL_BEGIN) &&
           ((__n == 0 ||
            (iVar11 = bcmp(((iVar16._M_current)->Value)._M_dataplus._M_p,DAT_00b64248,__n),
            iVar11 == 0)))) {
          this_00 = std::
                    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::_M_erase(__return_storage_ptr__,iVar16);
          pBVar7 = (__return_storage_ptr__->
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          lVar19 = ((long)pBVar7 - (long)this_00._M_current >> 4) * -0x5555555555555555 >> 2;
          this_01 = this_00;
          if (0 < lVar19) {
            this_01._M_current = this_00._M_current + lVar19 * 4;
            lVar19 = lVar19 + 1;
            do {
              bVar9 = __gnu_cxx::__ops::
                      _Iter_pred<cmGeneratorTarget::GetLinkOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0>
                      ::operator()((_Iter_pred<cmGeneratorTarget::GetLinkOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
                                    *)this_00._M_current,
                                   (__normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    )iVar16._M_current);
              __position._M_current = this_00._M_current;
              if (bVar9) goto LAB_0058fa08;
              bVar9 = __gnu_cxx::__ops::
                      _Iter_pred<cmGeneratorTarget::GetLinkOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0>
                      ::operator()((_Iter_pred<cmGeneratorTarget::GetLinkOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
                                    *)(this_00._M_current + 1),
                                   (__normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    )iVar16._M_current);
              __position._M_current = this_00._M_current + 1;
              if (bVar9) goto LAB_0058fa08;
              bVar9 = __gnu_cxx::__ops::
                      _Iter_pred<cmGeneratorTarget::GetLinkOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0>
                      ::operator()((_Iter_pred<cmGeneratorTarget::GetLinkOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
                                    *)(this_00._M_current + 2),
                                   (__normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    )iVar16._M_current);
              __position._M_current = this_00._M_current + 2;
              if (bVar9) goto LAB_0058fa08;
              bVar9 = __gnu_cxx::__ops::
                      _Iter_pred<cmGeneratorTarget::GetLinkOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0>
                      ::operator()((_Iter_pred<cmGeneratorTarget::GetLinkOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
                                    *)(this_00._M_current + 3),
                                   (__normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    )iVar16._M_current);
              __position._M_current = this_00._M_current + 3;
              if (bVar9) goto LAB_0058fa08;
              this_00._M_current = this_00._M_current + 4;
              lVar19 = lVar19 + -1;
            } while (1 < lVar19);
          }
          lVar19 = ((long)pBVar7 - (long)this_01._M_current >> 4) * -0x5555555555555555;
          if (lVar19 == 1) {
LAB_0058f9b0:
            bVar9 = __gnu_cxx::__ops::
                    _Iter_pred<cmGeneratorTarget::GetLinkOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0>
                    ::operator()((_Iter_pred<cmGeneratorTarget::GetLinkOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
                                  *)this_01._M_current,
                                 (__normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  )iVar16._M_current);
            __position._M_current = this_01._M_current;
            if (!bVar9) {
              __position._M_current = pBVar7;
            }
          }
          else if (lVar19 == 2) {
LAB_0058f9a0:
            bVar9 = __gnu_cxx::__ops::
                    _Iter_pred<cmGeneratorTarget::GetLinkOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0>
                    ::operator()((_Iter_pred<cmGeneratorTarget::GetLinkOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
                                  *)this_01._M_current,
                                 (__normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  )iVar16._M_current);
            __position._M_current = this_01._M_current;
            if (!bVar9) {
              this_01._M_current = this_01._M_current + 1;
              goto LAB_0058f9b0;
            }
          }
          else {
            __position._M_current = pBVar7;
            if ((lVar19 == 3) &&
               (bVar9 = __gnu_cxx::__ops::
                        _Iter_pred<cmGeneratorTarget::GetLinkOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0>
                        ::operator()((_Iter_pred<cmGeneratorTarget::GetLinkOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
                                      *)this_01._M_current,
                                     (__normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                      )iVar16._M_current),
               __position._M_current = this_01._M_current, !bVar9)) {
              this_01._M_current = this_01._M_current + 1;
              goto LAB_0058f9a0;
            }
          }
LAB_0058fa08:
          iVar16._M_current = __position._M_current;
          if (__position._M_current != pBVar7) {
            iVar16 = std::
                     vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::_M_erase(__return_storage_ptr__,__position);
          }
        }
        else {
          options.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          options.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          options.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cmSystemTools::ParseUnixCommandLine
                    (((iVar16._M_current)->Value)._M_dataplus._M_p,&options);
          anon_unknown.dwarf_24a5376::wrapOptions
                    (&hostOptions,&options,&(iVar16._M_current)->Backtrace,&wrapperFlag.Values,
                     &wrapperSep,bVar21);
          iVar16 = std::
                   vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::_M_erase(__return_storage_ptr__,iVar16);
          pBVar6 = (__return_storage_ptr__->
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          if (iVar16._M_current == pBVar6) {
            std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<BT<std::__cxx11::string>const*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>
                      ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                       __return_storage_ptr__,pBVar6,
                       hostOptions.
                       super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
            iVar16._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            pBVar7 = (__return_storage_ptr__->
                     super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<BT<std::__cxx11::string>*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>
                      ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                       __return_storage_ptr__,iVar16._M_current,
                       hostOptions.
                       super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
            iVar16._M_current =
                 iVar16._M_current +
                 (long)hostOptions.
                       super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish +
                 (long)(__return_storage_ptr__->
                       super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start +
                 (-(long)hostOptions.
                         super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start - (long)pBVar7);
          }
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&hostOptions);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&options);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)wrapperSep._M_dataplus._M_p != &wrapperSep.field_2) {
        operator_delete(wrapperSep._M_dataplus._M_p,wrapperSep.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&wrapperFlag.Values);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)wrapper._M_dataplus._M_p != &wrapper.field_2) {
        operator_delete(wrapper._M_dataplus._M_p,wrapper.field_2._M_allocated_capacity + 1);
      }
    }
    __x = ResolveLinkerWrapper(this,__return_storage_ptr__,language,false);
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=(__return_storage_ptr__,__x);
    std::
    _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>,std::_Select1st<std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>>
    ::
    _M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>&,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>&>
              ((_Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>,std::_Select1st<std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>>
                *)&this->LinkOptionsCache,&cacheKey,__return_storage_ptr__);
    std::vector<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>::
    ~vector(&entries.Entries);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&debugProperties.Values);
    if (dagChecker.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (dagChecker.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                 TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    std::
    _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&dagChecker.Seen._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dagChecker.Property._M_dataplus._M_p != &dagChecker.Property.field_2) {
      operator_delete(dagChecker.Property._M_dataplus._M_p,
                      dagChecker.Property.field_2._M_allocated_capacity + 1);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&uniqueOptions._M_h);
  }
  else {
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(__return_storage_ptr__,
             (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(iVar12._M_node + 3));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cacheKey.second._M_dataplus._M_p != &cacheKey.second.field_2) {
    operator_delete(cacheKey.second._M_dataplus._M_p,
                    cacheKey.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cacheKey.first._M_dataplus._M_p != &cacheKey.first.field_2) {
    operator_delete(cacheKey.first._M_dataplus._M_p,cacheKey.first.field_2._M_allocated_capacity + 1
                   );
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<BT<std::string>> cmGeneratorTarget::GetLinkOptions(
  std::string const& config, std::string const& language) const
{
  ConfigAndLanguage cacheKey(
    config, cmStrCat(language, this->IsDeviceLink() ? "-device" : ""));
  {
    auto it = this->LinkOptionsCache.find(cacheKey);
    if (it != this->LinkOptionsCache.end()) {
      return it->second;
    }
  }
  std::vector<BT<std::string>> result;
  std::unordered_set<std::string> uniqueOptions;

  cmGeneratorExpressionDAGChecker dagChecker(this, "LINK_OPTIONS", nullptr,
                                             nullptr);

  cmList debugProperties{ this->Makefile->GetDefinition(
    "CMAKE_DEBUG_TARGET_PROPERTIES") };
  bool debugOptions = !this->DebugLinkOptionsDone &&
    cm::contains(debugProperties, "LINK_OPTIONS");

  if (this->GlobalGenerator->GetConfigureDoneCMP0026()) {
    this->DebugLinkOptionsDone = true;
  }

  EvaluatedTargetPropertyEntries entries = EvaluateTargetPropertyEntries(
    this, config, language, &dagChecker, this->LinkOptionsEntries);

  AddInterfaceEntries(this, config, "INTERFACE_LINK_OPTIONS", language,
                      &dagChecker, entries, IncludeRuntimeInterface::Yes,
                      this->GetPolicyStatusCMP0099() == cmPolicies::NEW
                        ? LinkInterfaceFor::Link
                        : LinkInterfaceFor::Usage);

  processOptions(this, entries, result, uniqueOptions, debugOptions,
                 "link options", OptionsParse::Shell, this->IsDeviceLink());

  if (this->IsDeviceLink()) {
    // wrap host link options
    const std::string wrapper(this->Makefile->GetSafeDefinition(
      "CMAKE_" + language + "_DEVICE_COMPILER_WRAPPER_FLAG"));
    cmList wrapperFlag{ wrapper };
    const std::string wrapperSep(this->Makefile->GetSafeDefinition(
      "CMAKE_" + language + "_DEVICE_COMPILER_WRAPPER_FLAG_SEP"));
    bool concatFlagAndArgs = true;
    if (!wrapperFlag.empty() && wrapperFlag.back() == " ") {
      concatFlagAndArgs = false;
      wrapperFlag.pop_back();
    }

    auto it = result.begin();
    while (it != result.end()) {
      if (it->Value == DL_BEGIN) {
        // device link options, no treatment
        it = result.erase(it);
        it = std::find_if(it, result.end(), [](const BT<std::string>& item) {
          return item.Value == DL_END;
        });
        if (it != result.end()) {
          it = result.erase(it);
        }
      } else {
        // host link options must be wrapped
        std::vector<std::string> options;
        cmSystemTools::ParseUnixCommandLine(it->Value.c_str(), options);
        auto hostOptions = wrapOptions(options, it->Backtrace, wrapperFlag,
                                       wrapperSep, concatFlagAndArgs);
        it = result.erase(it);
        // some compilers (like gcc 4.8 or Intel 19.0 or XLC 16) do not respect
        // C++11 standard: 'std::vector::insert()' do not returns an iterator,
        // so need to recompute the iterator after insertion.
        if (it == result.end()) {
          cm::append(result, hostOptions);
          it = result.end();
        } else {
          auto index = it - result.begin();
          result.insert(it, hostOptions.begin(), hostOptions.end());
          it = result.begin() + index + hostOptions.size();
        }
      }
    }
  }

  // Last step: replace "LINKER:" prefixed elements by
  // actual linker wrapper
  result = this->ResolveLinkerWrapper(result, language);

  this->LinkOptionsCache.emplace(cacheKey, result);
  return result;
}